

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

_Bool parse_vrp_file(Instance *instance,FILE *filehandle,char *filepath)

{
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  size_t __n;
  char *__ptr;
  size_t sVar4;
  double *pdVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  byte bVar10;
  bool bVar11;
  double dVar12;
  int32_t dim;
  VrplibParser parser;
  anon_struct_24_4_1626e806 sections [5];
  double local_f0;
  VrplibParser local_e8;
  char *local_b0;
  char *local_a8;
  code *local_a0;
  char local_98 [8];
  char *local_90;
  code *local_88;
  undefined2 local_80;
  char *local_78;
  code *local_70;
  undefined2 local_68;
  char *local_60;
  code *local_58;
  undefined2 local_50;
  char *local_48;
  code *local_40;
  undefined1 local_38;
  undefined1 local_37;
  
  bVar2 = 0;
  fseek((FILE *)filehandle,0,2);
  __n = ftell((FILE *)filehandle);
  fseek((FILE *)filehandle,0,0);
  __ptr = (char *)malloc(__n + 1);
  if (__ptr != (char *)0x0) {
    sVar4 = fread(__ptr,1,__n,(FILE *)filehandle);
    bVar2 = 0;
    if (sVar4 == __n) {
      __ptr[__n] = '\0';
      local_e8.curline = 0;
      local_e8._28_4_ = 0;
      local_e8._40_8_ = 0;
      bVar11 = true;
      bVar9 = false;
      local_e8.filename = filepath;
      local_e8.base = __ptr;
      local_e8.at = __ptr;
      local_e8.size = __n;
      do {
        if ((local_e8.base + (local_e8.size - (long)local_e8.at) == (char *)0x0) || (bVar9)) break;
        parser_eat_all_blanks(&local_e8);
        _Var1 = parser_match_string(&local_e8,"#");
        if (_Var1) {
          for (; (((long)local_e8.base - (long)local_e8.at != -local_e8.size &&
                  (*local_e8.at != '\n')) && (*local_e8.at != '\r'));
              local_e8.at = local_e8.at +
                            ((long)local_e8.base - (long)local_e8.at != -local_e8.size)) {
          }
          parser_eat_newline(&local_e8);
          for (; ((long)local_e8.base - (long)local_e8.at != -local_e8.size &&
                 ((*local_e8.at == ' ' || (*local_e8.at == '\t'))));
              local_e8.at = local_e8.at +
                            ((long)local_e8.base - (long)local_e8.at != -local_e8.size)) {
          }
LAB_00102b69:
          pcVar8 = (char *)0x0;
        }
        else {
          pcVar8 = parse_hdr_field(&local_e8,"NAME");
          if (pcVar8 == (char *)0x0) {
            pcVar8 = parse_hdr_field(&local_e8,"COMMENT");
            if (pcVar8 == (char *)0x0) {
              pcVar8 = parse_hdr_field(&local_e8,"TYPE");
              if (pcVar8 == (char *)0x0) {
                pcVar8 = parse_hdr_field(&local_e8,"DIMENSION");
                if (pcVar8 == (char *)0x0) {
                  pcVar8 = parse_hdr_field(&local_e8,"VEHICLES");
                  if (pcVar8 == (char *)0x0) {
                    pcVar8 = parse_hdr_field(&local_e8,"EDGE_WEIGHT_TYPE");
                    if (pcVar8 == (char *)0x0) {
                      pcVar8 = parse_hdr_field(&local_e8,"EDGE_WEIGHT_FORMAT");
                      if (pcVar8 == (char *)0x0) {
                        pcVar8 = parse_hdr_field(&local_e8,"CAPACITY");
                        if (pcVar8 == (char *)0x0) {
                          bVar9 = true;
                          goto LAB_00102b69;
                        }
                        local_f0 = 0.0;
                        _Var1 = str_to_double(pcVar8,&local_f0);
                        if (!_Var1) {
                          bVar11 = false;
                          parse_error(&local_e8,
                                      "expected valid number for CAPACITY field. Got `%s` instead",
                                      pcVar8);
                        }
                        dVar12 = local_f0;
                        if (local_f0 <= 0.0) {
                          dVar12 = 0.0;
                        }
                        instance->vehicle_cap = dVar12;
                      }
                      else {
                        iVar3 = strcmp(pcVar8,"FUNCTION");
                        if (iVar3 == 0) {
                          local_e8._40_8_ = local_e8._40_8_ & 0xffffffff00000000;
                        }
                        else {
                          iVar3 = strcmp(pcVar8,"UPPER_ROW");
                          if (iVar3 != 0) {
                            pcVar7 = "unsupported format `%s` for EDGE_WEIGHT_FORMAT";
                            goto LAB_0010296d;
                          }
                          local_e8.edgew_format = 1;
                        }
                      }
                    }
                    else {
                      lVar6 = 0;
                      local_b0 = __ptr;
                      do {
                        iVar3 = strcmp(pcVar8,*(char **)((long)&SUPPORTED_EDGEW[0].name + lVar6));
                        if (iVar3 == 0) {
                          local_e8.edgew_format =
                               *(undefined4 *)((long)&SUPPORTED_EDGEW[0].fmt + lVar6);
                          __ptr = local_b0;
                          goto LAB_00102b6b;
                        }
                        lVar6 = lVar6 + 0x10;
                      } while (lVar6 == 0x10);
                      bVar11 = false;
                      parse_error(&local_e8,"Found unsupported EDGE_WEIGHT_TYPE (`%s`)",pcVar8);
                      __ptr = local_b0;
                    }
                  }
                  else {
                    local_f0 = (double)((ulong)local_f0 & 0xffffffff00000000);
                    _Var1 = str_to_int32(pcVar8,(int32_t *)&local_f0);
                    if (!_Var1) {
                      bVar11 = false;
                      parse_error(&local_e8,
                                  "expected valid integer for VEHICLES field. Got `%s` instead",
                                  pcVar8);
                    }
                    iVar3 = local_f0._0_4_;
                    if (local_f0._0_4_ < 1) {
                      iVar3 = 0;
                    }
                    instance->num_vehicles = iVar3;
                  }
                }
                else {
                  local_f0 = (double)((ulong)local_f0 & 0xffffffff00000000);
                  _Var1 = str_to_int32(pcVar8,(int32_t *)&local_f0);
                  if (!_Var1) {
                    bVar11 = false;
                    parse_error(&local_e8,
                                "expected valid integer for DIMENSION field. Got `%s` instead",
                                pcVar8);
                  }
                  iVar3 = local_f0._0_4_;
                  if (local_f0._0_4_ < 2) {
                    iVar3 = 1;
                  }
                  instance->num_customers = iVar3 + -1;
                }
              }
              else {
                iVar3 = strcmp(pcVar8,"CVRP");
                if (iVar3 != 0) {
                  pcVar7 = "only CVRP type is supported. Found `%s` instead";
LAB_0010296d:
                  bVar11 = false;
                  parse_error(&local_e8,pcVar7,pcVar8);
                }
              }
            }
            else {
              pcVar7 = strdup(pcVar8);
              instance->comment = pcVar7;
            }
          }
          else {
            instance_set_name(instance,pcVar8);
          }
        }
LAB_00102b6b:
        if (pcVar8 != (char *)0x0) {
          free(pcVar8);
        }
      } while (bVar11);
      if (bVar11) {
        if (instance->num_customers < 1) {
          pcVar8 = "couldn\'t deduce number of customers after parsing the VRPLIB header";
        }
        else {
          if (0.0 < instance->vehicle_cap) {
            _Var1 = prep_memory(instance);
            if (_Var1) {
              bVar11 = local_e8.edgew_format == EDGE_WEIGHT_FORMAT_EXPLICIT;
              if (bVar11) {
                pdVar5 = (double *)
                         malloc((long)(((instance->num_customers + 1) * instance->num_customers) / 2
                                      ) << 3);
                instance->edge_weight = pdVar5;
                if (pdVar5 == (double *)0x0) {
                  iVar3 = 0x2c9;
                  goto LAB_00102de4;
                }
              }
              local_a8 = "NODE_COORD_SECTION";
              local_a0 = parse_vrplib_nodecoord_section;
              local_98[0] = '\x01';
              local_98[1] = '\0';
              local_90 = "DEMAND_SECTION";
              local_88 = parse_vrplib_demand_section;
              local_80 = 1;
              local_78 = "DEPOT_SECTION";
              local_70 = parse_vrplib_depot_section;
              local_68 = 1;
              local_60 = "PROFIT_SECTION";
              local_58 = parse_vrplib_profit_section;
              local_50 = 0;
              local_48 = "EDGE_WEIGHT_SECTION";
              local_40 = parse_vrplib_edge_weight_section;
              local_37 = 0;
              bVar2 = 1;
              local_38 = bVar11;
              do {
                if ((bVar2 & 1) == 0) break;
                if ((local_e8.base + (local_e8.size - (long)local_e8.at) == (char *)0x0) ||
                   (_Var1 = parser_match_string(&local_e8,"EOF"), _Var1)) {
                  bVar11 = false;
                }
                else {
                  lVar6 = 0;
                  do {
                    pcVar8 = *(char **)((long)&local_a8 + lVar6);
                    _Var1 = parser_match_string(&local_e8,pcVar8);
                    if ((_Var1) && (_Var1 = parser_match_newline(&local_e8), _Var1)) {
                      bVar10 = local_98[lVar6 + 1];
                      pcVar7 = "Multiple definitions for section `%s`";
                      if (bVar10 == 0) {
                        local_98[lVar6 + 1] = '\x01';
                        bVar2 = (**(code **)((long)&local_a0 + lVar6))(&local_e8,instance);
                        pcVar7 = "Failure while parsing section `%s`";
                        if (bVar2 != 0) {
                          bVar10 = 1;
                          goto LAB_00102d7f;
                        }
                      }
                      bVar10 = bVar10 ^ 1;
                      bVar2 = 0;
                      parse_error(&local_e8,pcVar7,pcVar8);
                      goto LAB_00102d7f;
                    }
                    lVar6 = lVar6 + 0x18;
                  } while (lVar6 != 0x78);
                  bVar10 = 0;
LAB_00102d7f:
                  bVar11 = true;
                  if (bVar10 == 0) {
                    bVar2 = 0;
                    parse_error(&local_e8,"invalid input");
                  }
                }
              } while (bVar11);
              if ((bVar2 & 1) != 0) {
                parser_eat_all_blanks(&local_e8);
                if (local_e8.base + (local_e8.size - (long)local_e8.at) != (char *)0x0) {
                  pcVar8 = "Found premature `EOF` while more input is still available";
                  goto LAB_00102ec2;
                }
                lVar6 = 0;
                do {
                  if ((local_98[lVar6] == '\x01') && (local_98[lVar6 + 1] == '\0')) {
                    bVar2 = 0;
                    parse_error(&local_e8,"Required section `%s` was not found",
                                *(undefined8 *)((long)&local_a8 + lVar6));
                    iVar3 = 2;
                    goto LAB_00102e38;
                  }
                  lVar6 = lVar6 + 0x18;
                } while (lVar6 != 0x78);
                iVar3 = 0xc;
LAB_00102e38:
                if (iVar3 != 2) {
                  if (iVar3 != 0xc) goto LAB_00102e79;
                  if ((*instance->demands != 0.0) || (NAN(*instance->demands))) {
                    parse_error(&local_e8,
                                "demand for the depot node should be `0`. Got `%f` instead");
                    goto LAB_00102e69;
                  }
                }
              }
            }
            else {
              iVar3 = 0x2bd;
LAB_00102de4:
              bVar2 = 0;
              log_log(0x80,
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/parser.c"
                      ,iVar3,"Failed to prepare memory for storing instance");
            }
            goto LAB_00102e6c;
          }
          pcVar8 = "couldn\'t deduce vehicle capacity after parsing the VRPLIB header";
        }
LAB_00102ec2:
        bVar2 = 0;
        parse_error(&local_e8,pcVar8);
      }
      else {
LAB_00102e69:
        bVar2 = 0;
      }
    }
  }
LAB_00102e6c:
  if (__ptr != (char *)0x0) {
    free(__ptr);
  }
LAB_00102e79:
  return (_Bool)(bVar2 & 1);
}

Assistant:

bool parse_vrp_file(Instance *instance, FILE *filehandle,
                    const char *filepath) {

    bool result = true;
    size_t filesize = get_file_size(filehandle);

    // + 1 for null termination
    char *buffer = malloc(filesize + 1);
    if (!buffer) {
        result = false;
        goto terminate;
    }

    size_t readamt = fread(buffer, 1, filesize, filehandle);
    if (readamt != filesize) {
        result = false;
        goto terminate;
    }

    // NULL terminate the buffer
    buffer[filesize] = 0;
    VrplibParser parser = {0};
    parser.filename = filepath;
    parser.base = buffer;
    parser.at = buffer;
    parser.size = filesize;

    // First extract the header information
    if (!parse_vrplib_hdr(&parser, instance)) {
        result = false;
        goto terminate;
    }

    if (instance->num_customers <= 0) {
        parse_error(&parser, "couldn't deduce number of customers after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    } else if (instance->vehicle_cap <= 0.0) {
        parse_error(&parser, "couldn't deduce vehicle capacity after "
                             "parsing the VRPLIB header");
        result = false;
        goto terminate;
    }

    if (!prep_memory(instance)) {
        log_fatal("Failed to prepare memory for storing instance");
        result = false;
        goto terminate;
    }

    bool needs_edge_section = parser_needs_edge_section(&parser);

    if (needs_edge_section) {
        instance->edge_weight =
            malloc(hm_nentries(1 + instance->num_customers) *
                   sizeof(*instance->edge_weight));
        if (!instance->edge_weight) {
            log_fatal("Failed to prepare memory for storing instance");
            result = false;
            goto terminate;
        }
    }

    struct {
        char *name;
        bool (*parse_fn)(VrplibParser *p, Instance *instance);
        bool required;
        bool found;
    } sections[] = {
        {"NODE_COORD_SECTION", parse_vrplib_nodecoord_section, 1, 0},
        {"DEMAND_SECTION", parse_vrplib_demand_section, 1, 0},
        {"DEPOT_SECTION", parse_vrplib_depot_section, 1, 0},
        {"PROFIT_SECTION", parse_vrplib_profit_section, 0, 0},
        {"EDGE_WEIGHT_SECTION", parse_vrplib_edge_weight_section,
         needs_edge_section, 0},
    };

    while (result) {
        bool done =
            parser_is_eof(&parser) || parser_match_string(&parser, "EOF");
        if (done) {
            break;
        }

        bool found_matching_section = false;
        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (parser_match_string(&parser, sections[secid].name) &&
                parser_match_newline(&parser)) {
                if (sections[secid].found) {
                    parse_error(&parser,
                                "Multiple definitions for section `%s`",
                                sections[secid].name);
                    result = false;
                    break;
                }

                sections[secid].found = true;
                found_matching_section = true;
                result = sections[secid].parse_fn(&parser, instance);
                if (!result) {
                    parse_error(&parser, "Failure while parsing section `%s`",
                                sections[secid].name);
                    result = false;
                }
                break;
            }
        }
        if (!found_matching_section) {
            parse_error(&parser, "invalid input");
            result = false;
        }
    }

    if (result) {

        // Keep eating whitespaces and newlines while there are any
        parser_eat_all_blanks(&parser);

        if (parser_remainder_size(&parser) != 0) {
            parse_error(&parser, "Found premature `EOF` while more input "
                                 "is still available");
            result = false;
            goto terminate;
        }

        for (int32_t secid = 0; secid < ARRAY_LEN_i32(sections); secid++) {
            if (sections[secid].required && !sections[secid].found) {
                parse_error(&parser, "Required section `%s` was not found",
                            sections[secid].name);
                result = false;
                goto terminate;
            }
        }

        if (instance->demands[0] != 0) {
            parse_error(
                &parser,
                "demand for the depot node should be `0`. Got `%f` instead",
                instance->demands[0]);
            result = false;
            goto terminate;
        }
    }

terminate:
    if (buffer) {
        free(buffer);
    }
    return result;
}